

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

bool cfd::core::MatchWallyTx(wally_tx *src,wally_tx *dest)

{
  bool bVar1;
  CfdException *pCVar2;
  allocator local_75;
  int ret;
  undefined1 local_70 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> dest_txid;
  vector<unsigned_char,_std::allocator<unsigned_char>_> src_txid;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&src_txid,0x20,(allocator_type *)local_70);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&dest_txid,0x20,(allocator_type *)local_70);
  ret = wally_tx_get_txid(src,src_txid.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                          (long)src_txid.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)src_txid.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
  if (ret != 0) {
    local_70._0_8_ = "cfdcore_psbt.cpp";
    local_70._8_4_ = 0x148;
    local_70._16_8_ = "MatchWallyTx";
    logger::warn<int&>((CfdSourceLocation *)local_70,"wally_tx_get_txid NG[{}]",&ret);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_70,"psbt get txid error.",&local_75);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ret = wally_tx_get_txid(dest,dest_txid.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                          (long)dest_txid.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)dest_txid.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    bVar1 = ::std::operator==(&src_txid,&dest_txid);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&dest_txid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&src_txid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return bVar1;
  }
  local_70._0_8_ = "cfdcore_psbt.cpp";
  local_70._8_4_ = 0x14d;
  local_70._16_8_ = "MatchWallyTx";
  logger::warn<int&>((CfdSourceLocation *)local_70,"wally_tx_get_txid NG[{}]",&ret);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_70,"psbt get txid error.",&local_75);
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_70);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool MatchWallyTx(struct wally_tx *src, struct wally_tx *dest) {
  std::vector<uint8_t> src_txid(WALLY_TXHASH_LEN);
  std::vector<uint8_t> dest_txid(WALLY_TXHASH_LEN);
  int ret = wally_tx_get_txid(src, src_txid.data(), src_txid.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_txid NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt get txid error.");
  }
  ret = wally_tx_get_txid(dest, dest_txid.data(), dest_txid.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_txid NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt get txid error.");
  }
  return (src_txid == dest_txid);
}